

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOD.h
# Opt level: O2

bool dg::DODRanganath::onallpaths(CDNode *from,CDNode *n,CDGraph *G)

{
  bool bVar1;
  mapped_type *pmVar2;
  CDNode *from_local;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  unordered_map<dg::CDNode_*,_NodeInf,_std::hash<dg::CDNode_*>,_std::equal_to<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_NodeInf>_>_>
  data;
  
  if (from == n) {
    bVar1 = true;
  }
  else {
    data._M_h._M_buckets = &data._M_h._M_single_bucket;
    data._M_h._M_bucket_count = 1;
    data._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    data._M_h._M_element_count = 0;
    data._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    data._M_h._M_rehash_policy._M_next_resize = 0;
    data._M_h._M_single_bucket = (__node_base_ptr)0x0;
    from_local = from;
    std::__detail::
    _Rehash_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_NodeInf>,_std::allocator<std::pair<dg::CDNode_*const,_NodeInf>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_std::integral_constant<bool,_true>_>
    ::reserve((_Rehash_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_NodeInf>,_std::allocator<std::pair<dg::CDNode_*const,_NodeInf>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_std::integral_constant<bool,_true>_>
               *)&data,(long)(G->_nodes).
                             super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(G->_nodes).
                             super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3);
    local_60 = std::
               _Function_handler<bool_(dg::CDNode_*,_dg::CDNode_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mchalupa[P]dg/lib/ControlDependence/DOD.h:576:17)>
               ::_M_invoke;
    local_68 = std::
               _Function_handler<bool_(dg::CDNode_*,_dg::CDNode_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mchalupa[P]dg/lib/ControlDependence/DOD.h:576:17)>
               ::_M_manager;
    local_78._M_unused._0_8_ =
         (undefined8)
         (_Rehash_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_NodeInf>,_std::allocator<std::pair<dg::CDNode_*const,_NodeInf>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_std::integral_constant<bool,_true>_>
          *)&data;
    local_78._8_8_ = &local_78;
    pmVar2 = std::__detail::
             _Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_NodeInf>,_std::allocator<std::pair<dg::CDNode_*const,_NodeInf>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_NodeInf>,_std::allocator<std::pair<dg::CDNode_*const,_NodeInf>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&data,&from_local);
    pmVar2->onstack = true;
    bVar1 = std::function<bool_(dg::CDNode_*,_dg::CDNode_*)>::operator()
                      ((function<bool_(dg::CDNode_*,_dg::CDNode_*)> *)&local_78,from_local,n);
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
    std::
    _Hashtable<dg::CDNode_*,_std::pair<dg::CDNode_*const,_NodeInf>,_std::allocator<std::pair<dg::CDNode_*const,_NodeInf>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&data._M_h);
  }
  return bVar1;
}

Assistant:

static bool onallpaths(CDNode *from, CDNode *n, CDGraph &G) {
        if (from == n) // fast path
            return true;

        struct NodeInf {
            bool onstack{false};
            bool visited{false};
        };
        std::unordered_map<CDNode *, NodeInf> data;

        data.reserve(G.size());

        const std::function<bool(CDNode *, CDNode *)> onallpths =
                [&](CDNode *node, CDNode *target) -> bool {
            if (node == target)
                return true;

            data[node].visited = true;

            if (!node->hasSuccessors())
                return false;

            for (auto *s : node->successors()) {
                if (data[s].onstack)
                    return false;
                if (!data[s].visited) {
                    data[s].onstack = true;
                    if (!onallpths(s, target))
                        return false;
                    data[s].onstack = false;
                }
            }
            // if we have successors and got here,
            // then all successors reach target
            return true;
        };

        data[from].onstack = true;
        // DBG(tmp, "on all paths:" << from->getID() << ", " << n->getID() << ":
        // " << r );
        return onallpths(from, n);
    }